

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_rtr_32(void)

{
  uint uVar1;
  
  uVar1 = m68ki_pull_16();
  m68ki_set_ccr(uVar1);
  uVar1 = m68ki_pull_32();
  m68ki_jump(uVar1);
  return;
}

Assistant:

static void m68k_op_rtr_32(void)
{
	m68ki_trace_t0();				   /* auto-disable (see m68kcpu.h) */
	m68ki_set_ccr(m68ki_pull_16());
	m68ki_jump(m68ki_pull_32());
}